

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int __thiscall Pathie::Path::mkdir(Path *this,char *__path,__mode_t __mode)

{
  int iVar1;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  
  utf8_to_filename(&nstr,&this->m_path);
  iVar1 = ::mkdir(nstr._M_dataplus._M_p,0x1ff);
  if (-1 < iVar1) {
    iVar1 = std::__cxx11::string::_M_dispose();
    return iVar1;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::mkdir() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  if (::mkdir(nstr.c_str(), S_IRWXU | S_IRWXG | S_IRWXO) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(m_path);

  if (_wmkdir(utf16.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif
}